

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::CommandPoolManager::CommandPoolManager(CommandPoolManager *this,CreateInfo *CI)

{
  IMemoryAllocator *Allocator;
  STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>
  local_38;
  CreateInfo *local_18;
  CreateInfo *CI_local;
  CommandPoolManager *this_local;
  
  this->m_LogicalDevice = CI->LogicalDevice;
  local_18 = CI;
  CI_local = (CreateInfo *)this;
  std::__cxx11::string::string((string *)&this->m_Name,(string *)&CI->Name);
  (this->m_QueueFamilyIndex).m_Value = (local_18->queueFamilyIndex).m_Value;
  this->m_CmdPoolFlags = local_18->flags;
  std::mutex::mutex(&this->m_Mutex);
  Allocator = GetRawAllocator();
  STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>
  ::STDAllocator(&local_38,Allocator,"Allocator for deque<VulkanUtilities::CommandPoolWrapper>",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandPoolManager.cpp"
                 ,0x2a);
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
  ::deque(&this->m_CmdPools,&local_38);
  std::atomic<int>::atomic(&this->m_AllocatedPoolCounter,0);
  return;
}

Assistant:

CommandPoolManager::CommandPoolManager(const CreateInfo& CI) noexcept :
    // clang-format off
    m_LogicalDevice   {CI.LogicalDevice   },
    m_Name            {CI.Name            },
    m_QueueFamilyIndex{CI.queueFamilyIndex},
    m_CmdPoolFlags    {CI.flags           },
    m_CmdPools        (STD_ALLOCATOR_RAW_MEM(VulkanUtilities::CommandPoolWrapper, GetRawAllocator(), "Allocator for deque<VulkanUtilities::CommandPoolWrapper>"))
// clang-format on
{
}